

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  size_t sVar2;
  
  printOpenHeader(this,_name);
  poVar1 = (this->super_StreamingReporterBase).stream;
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam000000000017b690 = 0x2e2e2e2e2e2e2e;
    uRam000000000017b697 = 0x2e2e2e2e2e2e2e2e;
    _DAT_0017b680 = 0x2e2e2e2e2e2e2e2e;
    uRam000000000017b688 = 0x2e2e2e2e2e2e2e;
    DAT_0017b68f = 0x2e;
    _DAT_0017b670 = 0x2e2e2e2e2e2e2e2e;
    uRam000000000017b678 = 0x2e2e2e2e2e2e2e2e;
    _DAT_0017b660 = 0x2e2e2e2e2e2e2e2e;
    uRam000000000017b668 = 0x2e2e2e2e2e2e2e2e;
    _line = 0x2e2e2e2e2e2e2e2e;
    uRam000000000017b658 = 0x2e2e2e2e2e2e2e2e;
    DAT_0017b69f = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)46>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)46>()::line,sVar2)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  return;
}

Assistant:

void printClosedHeader( std::string const& _name ) {
            printOpenHeader( _name );
            stream << getLineOfChars<'.'>() << "\n";
        }